

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

int __thiscall
Hpipe::Lexer::push_tok(Lexer *this,Source *source,char *beg,char *end,Type type,int grp,char delim)

{
  pointer ppLVar1;
  int iVar2;
  bool bVar3;
  Lexem *pLVar4;
  Lexem *pLVar5;
  Lexem *item;
  allocator local_71;
  string local_70;
  Lexem *local_50;
  Type local_44;
  char *local_40;
  Source *local_38;
  
  local_44 = type;
  local_40 = beg;
  local_38 = source;
  if ((delim != ']') && (delim != ')')) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,beg,end);
    pLVar4 = Pool<Hpipe::Lexem,32>::
             New<Hpipe::Lexem::Type&,Hpipe::Source*&,char_const*&,std::__cxx11::string>
                       ((Pool<Hpipe::Lexem,32> *)&this->lexem_pool,&local_44,&local_38,&local_40,
                        &local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pLVar5 = this->last;
    local_50 = pLVar4;
    if (pLVar5 == (Lexem *)0x0) {
      pLVar5 = (this->stack_last).
               super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
      std::__cxx11::string::string((string *)&local_70,"[",&local_71);
      bVar3 = Lexem::eq(pLVar5,&local_70);
      pLVar5->children[bVar3] = pLVar4;
      std::__cxx11::string::~string((string *)&local_70);
      pLVar4->parent = pLVar5;
      pLVar5 = this->last;
    }
    else {
      pLVar5->next = pLVar4;
    }
    pLVar4->prev = pLVar5;
    this->last = pLVar4;
    if (grp < 0) {
      pLVar4->sibling = (Lexem *)0x0;
    }
    else {
      pLVar4->sibling = this->sibling[(uint)grp];
      this->sibling[(uint)grp] = pLVar4;
    }
    if ((delim == '[') || (delim == '(')) {
      std::vector<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>::push_back
                (&this->stack_last,&local_50);
      this->last = (Lexem *)0x0;
    }
    iVar2 = (int)local_40;
    goto LAB_001733c0;
  }
  ppLVar1 = (this->stack_last).super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_last).super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>._M_impl
      .super__Vector_impl_data._M_start == ppLVar1) {
    ErrorList::add(this->error_list,this->last->source,beg,
                   "Closing parenthesis without opening correspondance.");
  }
  else {
    pLVar5 = ppLVar1[-1];
    this->last = pLVar5;
    (this->stack_last).super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar1 + -1;
    if (delim == ']') {
      std::__cxx11::string::string((string *)&local_70,"[",(allocator *)&local_50);
      bVar3 = Lexem::eq(pLVar5,&local_70);
    }
    else {
      if (delim != ')') goto LAB_0017331f;
      std::__cxx11::string::string((string *)&local_70,"(",(allocator *)&local_50);
      bVar3 = Lexem::eq(pLVar5,&local_70);
    }
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar3 == false) {
      err(this,this->last,"Non matching parenthesis.");
    }
  }
LAB_0017331f:
  iVar2 = (int)beg;
LAB_001733c0:
  return (int)end - iVar2;
}

Assistant:

int Lexer::push_tok( Source *source, const char *beg, const char *end, Lexem::Type type, int grp, char delim ) {
    if ( delim == ')' or delim == ']' ) {
        if ( stack_last.empty() ) {
            error_list.add( last->source, beg, "Closing parenthesis without opening correspondance." );
            return end - beg;
        }
        last = stack_last.back();
        stack_last.pop_back();
        if ( ( delim == ')' and not last->eq( "(" ) ) or ( delim == ']' and not last->eq( "[" ) ) )
            err( last, "Non matching parenthesis." );
        return end - beg;
    }

    Lexem *item = lexem_pool.New( type, source, beg, std::string{ beg, end } );
    if ( last ) {
        last->next = item;
    } else {
        Lexem *p = stack_last.back();
        p->children[ p->eq( "[" ) ] = item;
        item->parent = p;
    }
    item->prev = last;
    last = item;

    if ( grp >= 0 ) {
        item->sibling = sibling[ grp ];
        sibling[ grp ] = item;
    } else
        item->sibling = 0;

    // PRINT( String( beg, end ), grp, type );
    if ( delim == '(' or delim == '[' ) {
        stack_last.push_back( item );
        last = 0;
    }

    return end - beg;
}